

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

TVMRetValue __thiscall tvm::runtime::PackedFunc::operator()<>(PackedFunc *this)

{
  TVMArgs __args;
  undefined8 extraout_RDX;
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *in_RSI;
  TVMRetValue TVar1;
  TVMArgs local_60;
  undefined1 local_41;
  TVMArgsSetter local_40;
  int local_2c;
  int type_codes [1];
  TVMValue_conflict values [1];
  int kArraySize;
  int kNumArgs;
  PackedFunc *this_local;
  TVMRetValue *rv;
  
  TVMArgsSetter::TVMArgsSetter(&local_40,(TVMValue_conflict *)&stack0xffffffffffffffd8,&local_2c);
  detail::for_each<tvm::runtime::TVMArgsSetter>(&local_40);
  local_41 = 0;
  TVMRetValue::TVMRetValue((TVMRetValue *)this);
  TVMArgs::TVMArgs(&local_60,(TVMValue_conflict *)&stack0xffffffffffffffd8,&local_2c,0);
  __args.type_codes = local_60.type_codes;
  __args.values = local_60.values;
  __args.num_args = local_60.num_args;
  __args._20_4_ = local_60._20_4_;
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::operator()
            (in_RSI,__args,(TVMRetValue *)this);
  TVar1.super_TVMPODValue_._8_8_ = extraout_RDX;
  TVar1.super_TVMPODValue_.value_.v_handle = this;
  return (TVMRetValue)TVar1.super_TVMPODValue_;
}

Assistant:

inline TVMRetValue PackedFunc::operator()(Args &&... args) const {
  const int kNumArgs = sizeof...(Args);
  const int kArraySize = kNumArgs > 0 ? kNumArgs : 1;
  TVMValue values[kArraySize];
  int type_codes[kArraySize];
  detail::for_each(TVMArgsSetter(values, type_codes),
                   std::forward<Args>(args)...);
  TVMRetValue rv;
  body_(TVMArgs(values, type_codes, kNumArgs), &rv);
  return rv;
}